

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UObject * __thiscall
icu_63::DefaultCalendarFactory::create
          (DefaultCalendarFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  ECalType EVar1;
  UnicodeString *this_00;
  Locale *this_01;
  ConstChar16Ptr local_150;
  char16_t *local_148;
  UnicodeString local_138;
  Locale loc;
  
  this_01 = &loc;
  Locale::Locale(this_01);
  (*(key->super_UObject)._vptr_UObject[0xc])(key);
  this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)this_01);
  if (this_00 == (UnicodeString *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    (this_00->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b0268;
    (this_00->fUnion).fStackFields.fLengthAndFlags = 2;
    UnicodeString::append(this_00,L'@');
    local_150.p_ = L"calendar=";
    UnicodeString::UnicodeString(&local_138,'\x01',&local_150,9);
    UnicodeString::append(this_00,&local_138);
    UnicodeString::~UnicodeString(&local_138);
    local_148 = local_150.p_;
    EVar1 = getCalendarTypeForLocale(loc.fullName);
    UnicodeString::UnicodeString(&local_138,gCalTypes[EVar1],-1,kInvariant);
    UnicodeString::append(this_00,&local_138);
    UnicodeString::~UnicodeString(&local_138);
  }
  Locale::~Locale(&loc);
  return (UObject *)this_00;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* /*service*/, UErrorCode& status) const  {

        LocaleKey &lkey = (LocaleKey&)key;
        Locale loc;
        lkey.currentLocale(loc);

        UnicodeString *ret = new UnicodeString();
        if (ret == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            ret->append((UChar)0x40); // '@' is a variant character
            ret->append(UNICODE_STRING("calendar=", 9));
            ret->append(UnicodeString(gCalTypes[getCalendarTypeForLocale(loc.getName())], -1, US_INV));
        }
        return ret;
    }